

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O1

char * loadfile(int fd,int *datasize)

{
  __off_t _Var1;
  __off_t _Var2;
  char *__ptr;
  ssize_t sVar3;
  int iVar4;
  int iVar5;
  
  if (fd == -1) {
LAB_0019ec9c:
    __ptr = (char *)0x0;
  }
  else {
    __ptr = (char *)0x0;
    _Var1 = lseek(fd,0,1);
    _Var2 = lseek(fd,0,2);
    lseek(fd,(long)(int)_Var1,0);
    iVar5 = (int)_Var2 - (int)_Var1;
    if (iVar5 != 0) {
      __ptr = (char *)malloc((long)(iVar5 + 1));
      iVar4 = iVar5;
      do {
        sVar3 = read(fd,__ptr + (iVar5 - iVar4),(long)iVar4);
        if ((int)sVar3 == -1) {
          free(__ptr);
          goto LAB_0019ec9c;
        }
        iVar4 = iVar4 - (int)sVar3;
      } while (iVar4 != 0);
      __ptr[iVar5] = '\0';
      *datasize = iVar5;
    }
  }
  return __ptr;
}

Assistant:

char *loadfile(int fd, int *datasize)
{
	int start, end, len, bytes_left, ret;
	char *data;
	
	if (fd == -1)
	    return NULL;
	
	start = lseek(fd, 0, SEEK_CUR);
	end = lseek(fd, 0, SEEK_END);
	lseek(fd, start, SEEK_SET);
	
	len = end - start;
	if (len == 0)
	    return NULL;
	
	data = malloc(len + 1);
	bytes_left = len;
	do {
	    /* read may return fewer bytes than requested for reasons that are not errors */
	    ret = read(fd, &data[len - bytes_left], bytes_left);
	    if (ret == -1) {
		free(data);
		return NULL;
	    }
	    
	    bytes_left -= ret;
	} while (bytes_left);
	data[len] = '\0';
	
	*datasize = len;
	return data;
}